

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O3

err_t stb99DiVal(stb99_seed *seed,size_t r)

{
  ulong uVar1;
  err_t eVar2;
  long lVar3;
  
  uVar1 = seed->di[0];
  if (((uVar1 < 0x1fffffffffffffff) && (seed->l <= uVar1 * 2)) && (uVar1 << 3 <= seed->l * 7 - r)) {
    lVar3 = 10;
    while (uVar1 = *(ulong *)(seed->zi + lVar3 * 4 + -4), 0x10 < uVar1) {
      if (0x3333333333333332 < uVar1) {
        return 0x20c;
      }
      if (uVar1 * 2 < *(ulong *)(seed->zi + lVar3 * 4 + -8)) {
        return 0x20c;
      }
      if (*(ulong *)(seed->zi + lVar3 * 4 + -8) * 4 - 0x10 <= uVar1 * 5) {
        return 0x20c;
      }
      lVar3 = lVar3 + 1;
      if (lVar3 == 0x1b) {
        eVar2 = 0x20c;
        if (seed->di[0x11] < 0x21) {
          eVar2 = 0;
        }
        return eVar2;
      }
    }
    if (*(ulong *)(seed->zi + lVar3 * 4 + -8) < 0x21) {
      if (lVar3 - 9U < 0x12) {
        do {
          if (*(long *)(seed->zi + lVar3 * 4 + -4) != 0) {
            return 0x20c;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x1b);
      }
      return 0;
    }
  }
  return 0x20c;
}

Assistant:

static err_t stb99DiVal(const stb99_seed* seed, size_t r)
{
	size_t i;
	// проверить di[0]
	ASSERT(7 * seed->l > r);
	if (seed->di[0] >= SIZE_MAX / 8 ||
		seed->l > 2 * seed->di[0] ||
		8 * seed->di[0] > 7 * seed->l - r)
		return ERR_BAD_SEED;
	ASSERT(seed->di[0] > 16);
	// проверить цепочку di
	for (i = 1; i < COUNT_OF(seed->di) && seed->di[i] > 16; ++i)
		if (seed->di[i] >= SIZE_MAX / 5 ||
			seed->di[i - 1] > 2 * seed->di[i] ||
			5 * seed->di[i] >= 4 * seed->di[i - 1] - 16)
			return ERR_BAD_SEED;
	if (seed->di[i - 1] > 32)
		return ERR_BAD_SEED;
	for (; i < COUNT_OF(seed->di); ++i)
		if (seed->di[i] != 0)
			return ERR_BAD_SEED;
	// все хорошо
	return ERR_OK;
}